

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS ref_import_meshb_int(FILE *file,REF_INT version,REF_INT *value)

{
  size_t sVar1;
  undefined8 uVar2;
  char *pcVar3;
  int int_value;
  long long_value;
  REF_INT local_14;
  REF_INT local_10 [2];
  
  if (version < 4) {
    sVar1 = fread(&local_14,4,1,(FILE *)file);
    local_10[0] = local_14;
    if (sVar1 != 1) {
      pcVar3 = "int value";
      uVar2 = 0x5d4;
LAB_001ec958:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar2,"ref_import_meshb_int",pcVar3,1,sVar1);
      return 1;
    }
  }
  else {
    sVar1 = fread(local_10,8,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar3 = "long value";
      uVar2 = 0x5d7;
      goto LAB_001ec958;
    }
  }
  *value = local_10[0];
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_import_meshb_int(FILE *file, REF_INT version,
                                               REF_INT *value) {
  int int_value;
  long long_value;
  if (version < 4) {
    REIS(1, fread(&int_value, sizeof(int), 1, file), "int value");
    *value = int_value;
  } else {
    REIS(1, fread(&long_value, sizeof(long), 1, file), "long value");
    *value = (REF_INT)long_value;
  }
  return REF_SUCCESS;
}